

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolo-image.cpp
# Opt level: O2

void embed_image(yolo_image *source,yolo_image *dest,int dx,int dy)

{
  int iVar1;
  uint uVar2;
  pointer pfVar3;
  pointer pfVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  bool bVar16;
  
  iVar1 = source->h;
  iVar6 = source->c;
  iVar9 = 0;
  iVar11 = 0;
  if (0 < iVar1) {
    iVar11 = iVar1;
  }
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (iVar12 = 0; iVar12 != iVar6; iVar12 = iVar12 + 1) {
    uVar2 = source->w;
    iVar7 = 0;
    uVar10 = 0;
    if (0 < (int)uVar2) {
      uVar10 = (ulong)uVar2;
    }
    iVar15 = uVar2 * iVar9;
    iVar13 = dy;
    for (; iVar7 != iVar11; iVar7 = iVar7 + 1) {
      pfVar3 = (source->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar4 = (dest->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar5 = (dest->h * iVar12 + iVar13) * dest->w + dx;
      uVar14 = uVar10;
      iVar8 = iVar15;
      while (bVar16 = uVar14 != 0, uVar14 = uVar14 - 1, bVar16) {
        pfVar4[iVar5] = pfVar3[iVar8];
        iVar5 = iVar5 + 1;
        iVar8 = iVar8 + 1;
      }
      iVar13 = iVar13 + 1;
      iVar15 = iVar15 + uVar2;
    }
    iVar9 = iVar9 + iVar1;
  }
  return;
}

Assistant:

static void embed_image(const yolo_image & source, yolo_image & dest, int dx, int dy)
{
    for (int k = 0; k < source.c; ++k) {
        for (int y = 0; y < source.h; ++y) {
            for (int x = 0; x < source.w; ++x) {
                float val = source.get_pixel(x, y, k);
                dest.set_pixel(dx+x, dy+y, k, val);
            }
        }
    }
}